

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3243::EvaluateSectionFrame
          (ChElementBeamANCF_3243 *this,double xi,ChVector<double> *point,ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  ChVector<double> CrossSectionY;
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_xi_compact;
  VectorN Sxi_eta_compact;
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  ChVector<double> local_2b0;
  ChVector<double> local_298;
  VectorN local_280;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_208 [8];
  Matrix3xN *local_200;
  VectorN *local_1f8;
  undefined8 local_1e8;
  double local_1d0;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  double local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  double local_190;
  undefined8 local_188;
  plain_array<double,_8,_0,_64> local_180;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  Calc_Sxi_compact(this,(VectorN *)&local_180,xi,0.0,0.0);
  Calc_Sxi_xi_compact(this,&local_280,xi,0.0,0.0);
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_190 = this->m_thicknessY * 0.25;
  local_1b0 = (1.0 - xi) * local_190;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  local_190 = (xi + 1.0) * local_190;
  local_188 = 0;
  CalcCoordMatrix(this,(Matrix3xN *)local_140);
  local_1f8 = &local_280;
  auVar10 = vmulpd_avx512f((undefined1  [64])local_180.array,local_140);
  auVar9 = vextractf64x4_avx512f(auVar10,1);
  dVar20 = auVar10._0_8_ + auVar9._0_8_ + auVar10._8_8_ + auVar9._8_8_;
  dVar27 = auVar10._16_8_ + auVar9._16_8_ + auVar10._24_8_ + auVar9._24_8_;
  auVar22._0_8_ = dVar20 + dVar27;
  auVar22._8_8_ = dVar20 + dVar27;
  dVar20 = (double)vmovlpd_avx(auVar22);
  point->m_data[0] = dVar20;
  auVar10 = vmulpd_avx512f((undefined1  [64])local_180.array,local_100);
  auVar9 = vextractf64x4_avx512f(auVar10,1);
  dVar20 = auVar10._0_8_ + auVar9._0_8_ + auVar10._8_8_ + auVar9._8_8_;
  dVar27 = auVar10._16_8_ + auVar9._16_8_ + auVar10._24_8_ + auVar9._24_8_;
  auVar23._0_8_ = dVar20 + dVar27;
  auVar23._8_8_ = dVar20 + dVar27;
  dVar20 = (double)vmovlpd_avx(auVar23);
  point->m_data[1] = dVar20;
  auVar10 = vmulpd_avx512f((undefined1  [64])local_180.array,local_c0);
  auVar9 = vextractf64x4_avx512f(auVar10,1);
  dVar20 = auVar10._0_8_ + auVar9._0_8_ + auVar10._8_8_ + auVar9._8_8_;
  dVar27 = auVar10._16_8_ + auVar9._16_8_ + auVar10._24_8_ + auVar9._24_8_;
  auVar8._0_8_ = dVar20 + dVar27;
  auVar8._8_8_ = dVar20 + dVar27;
  dVar20 = (double)vmovlpd_avx(auVar8);
  point->m_data[2] = dVar20;
  local_1d0 = this->m_lenX;
  local_1e8 = 0x4000000000000000;
  local_200 = (Matrix3xN *)local_140;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,8,1,3,8>,Eigen::Matrix<double,8,1,0,8,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_298,local_208,(type *)0x0);
  local_1d0 = this->m_thicknessY;
  local_1e8 = 0x4000000000000000;
  local_200 = (Matrix3xN *)local_140;
  local_1f8 = (VectorN *)&local_1c0;
  ChVector<double>::
  ChVector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,8,1,3,8>,Eigen::Matrix<double,8,1,0,8,1>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (&local_2b0,local_208,(type *)0x0);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_298.m_data[0];
  auVar7 = ZEXT816(0x3ff0000000000000);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_298.m_data[2];
  auVar6 = ZEXT816(0) << 0x40;
  if ((((local_298.m_data[0] != 0.0) || (NAN(local_298.m_data[0]))) || (local_298.m_data[1] != 0.0))
     || (NAN(local_298.m_data[1]))) {
LAB_007121a0:
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_298.m_data[1] * local_298.m_data[1];
    auVar6 = vfmadd231sd_fma(auVar33,auVar12,auVar12);
    auVar6 = vfmadd231sd_fma(auVar6,auVar29,auVar29);
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar20 = 1.0 / auVar6._0_8_;
    bVar4 = 2.2250738585072014e-308 <= auVar6._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)bVar4 * (long)(local_298.m_data[2] * dVar20);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)bVar4 * (long)(local_298.m_data[1] * dVar20);
    auVar7._0_8_ = (ulong)bVar4 * (long)(local_298.m_data[0] * dVar20) +
                   (ulong)!bVar4 * 0x3ff0000000000000;
    auVar7._8_8_ = 0;
  }
  else {
    auVar5 = ZEXT816(0) << 0x40;
    if ((local_298.m_data[2] != 0.0) || (NAN(local_298.m_data[2]))) goto LAB_007121a0;
  }
  dVar43 = auVar6._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_2b0.m_data[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_2b0.m_data[0];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_2b0.m_data[1];
  dVar45 = auVar7._0_8_;
  dVar44 = auVar5._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar45 * local_2b0.m_data[2];
  auVar8 = vfmsub231sd_fma(auVar30,auVar5,auVar37);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar44 * local_2b0.m_data[1];
  auVar12 = vfmsub231sd_fma(auVar24,auVar6,auVar34);
  dVar20 = auVar12._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar43 * local_2b0.m_data[0];
  auVar22 = vfmsub231sd_fma(auVar13,auVar7,auVar36);
  dVar27 = auVar22._0_8_;
  dVar28 = auVar8._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar28 * dVar28;
  auVar8 = vfmadd231sd_fma(auVar40,auVar12,auVar12);
  auVar8 = vfmadd231sd_fma(auVar8,auVar22,auVar22);
  auVar8 = vsqrtsd_avx(auVar8,auVar8);
  dVar32 = auVar8._0_8_;
  if (dVar32 < 0.0001) {
    auVar1._8_8_ = 0x7fffffffffffffff;
    auVar1._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar37,auVar1);
    if (0.9 <= auVar8._0_8_) {
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar8 = vandpd_avx512vl(auVar36,auVar2);
      if (0.9 <= auVar8._0_8_) {
        auVar3._8_8_ = 0x7fffffffffffffff;
        auVar3._0_8_ = 0x7fffffffffffffff;
        auVar8 = vandpd_avx512vl(auVar34,auVar3);
        auVar12 = ZEXT816(0);
        if (0.9 <= auVar8._0_8_) goto LAB_007122b6;
        auVar8 = ZEXT816(0x3ff0000000000000);
      }
      else {
        auVar12 = ZEXT816(0x3ff0000000000000);
LAB_007122b6:
        auVar8 = ZEXT816(0);
      }
      auVar22 = ZEXT816(0);
    }
    else {
      auVar22 = ZEXT816(0x3ff0000000000000);
      auVar8 = ZEXT816(0);
      auVar12 = ZEXT816(0);
    }
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar8._0_8_ * -dVar45;
    auVar23 = vfmadd231sd_fma(auVar31,auVar5,auVar22);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auVar12._0_8_ * -dVar44;
    auVar8 = vfmadd231sd_fma(auVar25,auVar6,auVar8);
    dVar20 = auVar8._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar22._0_8_ * -dVar43;
    auVar12 = vfmadd231sd_fma(auVar14,auVar7,auVar12);
    dVar27 = auVar12._0_8_;
    dVar28 = auVar23._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = dVar28 * dVar28;
    auVar8 = vfmadd231sd_fma(auVar35,auVar8,auVar8);
    auVar8 = vfmadd231sd_fma(auVar8,auVar12,auVar12);
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar32 = auVar8._0_8_;
  }
  dVar32 = 1.0 / dVar32;
  dVar20 = dVar20 * dVar32;
  dVar27 = dVar27 * dVar32;
  dVar28 = dVar28 * dVar32;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar27;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar44 * dVar20;
  auVar7 = vfmsub231sd_fma(auVar26,auVar15,auVar7);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar43 * dVar27;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar28;
  auVar8 = vfmsub231sd_fma(auVar41,auVar42,auVar5);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar20;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar45 * dVar28;
  auVar6 = vfmsub231sd_fma(auVar47,auVar38,auVar6);
  dVar21 = auVar7._0_8_;
  dVar32 = dVar27 + dVar45 + dVar21;
  dVar39 = auVar8._0_8_;
  dVar46 = auVar6._0_8_;
  if (0.0 <= dVar32) {
    dVar32 = dVar32 + 1.0;
    if (dVar32 < 0.0) {
      dVar27 = sqrt(dVar32);
    }
    else {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar32;
      auVar6 = vsqrtsd_avx(auVar17,auVar17);
      dVar27 = auVar6._0_8_;
    }
    dVar21 = dVar27 * 0.5;
    dVar27 = 0.5 / dVar27;
    dVar32 = (dVar46 - dVar28) * dVar27;
    dVar45 = (dVar20 - dVar44) * dVar27;
    dVar27 = (dVar43 - dVar39) * dVar27;
    goto LAB_007125a5;
  }
  if (dVar21 <= dVar45) {
    if (dVar45 < dVar27) goto LAB_00712384;
    dVar27 = ((dVar45 - dVar21) - dVar27) + 1.0;
    if (dVar27 < 0.0) {
      dVar11 = sqrt(dVar27);
    }
    else {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar27;
      auVar6 = vsqrtsd_avx(auVar19,auVar19);
      dVar11 = auVar6._0_8_;
    }
    dVar21 = dVar46 - dVar28;
    dVar32 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar45 = (dVar43 + dVar39) * dVar11;
    dVar27 = (dVar44 + dVar20) * dVar11;
  }
  else if (dVar21 < dVar27) {
LAB_00712384:
    dVar27 = ((dVar27 - dVar45) - dVar21) + 1.0;
    if (dVar27 < 0.0) {
      dVar11 = sqrt(dVar27);
    }
    else {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar27;
      auVar6 = vsqrtsd_avx(auVar18,auVar18);
      dVar11 = auVar6._0_8_;
    }
    dVar21 = dVar43 - dVar39;
    dVar27 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar32 = (dVar44 + dVar20) * dVar11;
    dVar45 = (dVar46 + dVar28) * dVar11;
  }
  else {
    dVar27 = ((dVar21 - dVar27) - dVar45) + 1.0;
    if (dVar27 < 0.0) {
      dVar11 = sqrt(dVar27);
    }
    else {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar27;
      auVar6 = vsqrtsd_avx(auVar16,auVar16);
      dVar11 = auVar6._0_8_;
    }
    dVar21 = dVar20 - dVar44;
    dVar45 = dVar11 * 0.5;
    dVar11 = 0.5 / dVar11;
    dVar27 = (dVar46 + dVar28) * dVar11;
    dVar32 = (dVar43 + dVar39) * dVar11;
  }
  dVar21 = dVar21 * dVar11;
LAB_007125a5:
  rot->m_data[0] = dVar21;
  rot->m_data[1] = dVar32;
  rot->m_data[2] = dVar45;
  rot->m_data[3] = dVar27;
  return;
}

Assistant:

void ChElementBeamANCF_3243::EvaluateSectionFrame(const double xi, ChVector<>& point, ChQuaternion<>& rot) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);
    VectorN Sxi_eta_compact;
    Calc_Sxi_eta_compact(Sxi_eta_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact * 2 / m_lenX;
    ChVector<double> CrossSectionY = e_bar * Sxi_eta_compact * 2 / m_thicknessY;

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the beam axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the cross section Y direction
    ChMatrix33<> msect;
    msect.Set_A_Xdir(BeamAxisTangent, CrossSectionY);

    rot = msect.Get_A_quaternion();
}